

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfImage.cpp
# Opt level: O0

bool __thiscall Imf_2_5::Image::levelNumberIsValid(Image *this,int lx,int ly)

{
  long lVar1;
  ImageLevel **ppIVar2;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  bool local_11;
  
  local_11 = false;
  if (-1 < in_ESI) {
    lVar1 = Array2D<Imf_2_5::ImageLevel_*>::width((Array2D<Imf_2_5::ImageLevel_*> *)(in_RDI + 0x50))
    ;
    local_11 = false;
    if ((in_ESI < lVar1) && (local_11 = false, -1 < in_EDX)) {
      lVar1 = Array2D<Imf_2_5::ImageLevel_*>::height
                        ((Array2D<Imf_2_5::ImageLevel_*> *)(in_RDI + 0x50));
      local_11 = false;
      if (in_EDX < lVar1) {
        ppIVar2 = Array2D<Imf_2_5::ImageLevel_*>::operator[]
                            ((Array2D<Imf_2_5::ImageLevel_*> *)(in_RDI + 0x50),(long)in_EDX);
        local_11 = ppIVar2[in_ESI] != (ImageLevel *)0x0;
      }
    }
  }
  return local_11;
}

Assistant:

bool
Image::levelNumberIsValid (int lx, int ly) const
{
    return lx >= 0 && lx < _levels.width() &&
           ly >= 0 && ly < _levels.height() &&
           _levels[ly][lx] != 0;
}